

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alprd.hpp
# Opt level: O0

double duckdb::alp::AlpRDCompression<float,_true>::BuildLeftPartsDictionary<true>
                 (vector<unsigned_int,_true> *values,uint8_t right_bit_width,State *state)

{
  bool bVar1;
  uchar b;
  byte bVar2;
  unsigned_short uVar3;
  mapped_type *pmVar4;
  size_type sVar5;
  reference pvVar6;
  byte *in_RDX;
  byte in_SIL;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  __type_conflict8 __x;
  double dVar7;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_short,_unsigned_short>,_false,_false>,_bool>
  pVar8;
  double estimated_size;
  idx_t i_1;
  idx_t dict_idx;
  uint8_t left_bit_width;
  uint64_t actual_dictionary_size;
  idx_t i;
  uint32_t exceptions_count;
  pair<const_unsigned_int,_int> *hash_pair;
  iterator __end0_1;
  iterator __begin0_1;
  unordered_map<unsigned_int,_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
  *__range3_1;
  uint left_tmp;
  uint *value;
  const_iterator __end0;
  const_iterator __begin0;
  vector<unsigned_int,_true> *__range3;
  vector<duckdb::alp::AlpRDLeftPartInfo,_true> left_parts_sorted_repetitions;
  unordered_map<unsigned_int,_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
  left_parts_hash;
  undefined4 in_stack_fffffffffffffe48;
  undefined1 in_stack_fffffffffffffe4c;
  undefined1 in_stack_fffffffffffffe4d;
  undefined2 in_stack_fffffffffffffe4e;
  unordered_map<unsigned_int,_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
  *in_stack_fffffffffffffe50;
  undefined7 in_stack_fffffffffffffe58;
  undefined1 in_stack_fffffffffffffe5f;
  _Node_iterator_base<std::pair<const_unsigned_short,_unsigned_short>,_false>
  in_stack_fffffffffffffe60;
  size_type in_stack_fffffffffffffe78;
  ulong uVar9;
  undefined7 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe87;
  pair<const_unsigned_short,_unsigned_short> local_11c;
  ulong local_118;
  _Node_iterator_base<std::pair<const_unsigned_short,_unsigned_short>,_false> local_110;
  undefined1 local_108;
  pair<const_unsigned_short,_unsigned_short> local_fc;
  unsigned_long local_f8;
  byte local_e9;
  unsigned_long local_e8;
  ulong local_e0;
  uint local_d8;
  AlpRDLeftPartInfo *local_d0;
  AlpRDLeftPartInfo *local_c8;
  reference local_c0;
  _Node_iterator_base<std::pair<const_unsigned_int,_int>,_false> local_b8;
  _Node_iterator_base<std::pair<const_unsigned_int,_int>,_false> local_b0;
  undefined1 *local_a8;
  uint local_8c;
  reference local_88;
  uint *local_80;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_70;
  vector<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_> local_68;
  undefined1 local_50 [56];
  byte *local_18;
  byte local_9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_8;
  
  local_18 = in_RDX;
  local_9 = in_SIL;
  local_8 = in_RDI;
  ::std::
  unordered_map<unsigned_int,_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
  ::unordered_map((unordered_map<unsigned_int,_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                   *)0xaac18e);
  vector<duckdb::alp::AlpRDLeftPartInfo,_true>::vector
            ((vector<duckdb::alp::AlpRDLeftPartInfo,_true> *)0xaac19b);
  local_70 = local_8;
  local_78._M_current =
       (uint *)::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          CONCAT26(in_stack_fffffffffffffe4e,
                                   CONCAT15(in_stack_fffffffffffffe4d,
                                            CONCAT14(in_stack_fffffffffffffe4c,
                                                     in_stack_fffffffffffffe48))));
  local_80 = (uint *)::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                CONCAT26(in_stack_fffffffffffffe4e,
                                         CONCAT15(in_stack_fffffffffffffe4d,
                                                  CONCAT14(in_stack_fffffffffffffe4c,
                                                           in_stack_fffffffffffffe48))));
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                             *)in_stack_fffffffffffffe50,
                            (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                             *)CONCAT26(in_stack_fffffffffffffe4e,
                                        CONCAT15(in_stack_fffffffffffffe4d,
                                                 CONCAT14(in_stack_fffffffffffffe4c,
                                                          in_stack_fffffffffffffe48)))), bVar1) {
    local_88 = __gnu_cxx::
               __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&local_78);
    local_8c = *local_88 >> (local_9 & 0x1f);
    pmVar4 = ::std::
             unordered_map<unsigned_int,_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](in_stack_fffffffffffffe50,
                          (key_type *)
                          CONCAT26(in_stack_fffffffffffffe4e,
                                   CONCAT15(in_stack_fffffffffffffe4d,
                                            CONCAT14(in_stack_fffffffffffffe4c,
                                                     in_stack_fffffffffffffe48))));
    *pmVar4 = *pmVar4 + 1;
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&local_78);
  }
  ::std::
  unordered_map<unsigned_int,_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
  ::size((unordered_map<unsigned_int,_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
          *)0xaac29c);
  ::std::vector<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>::
  reserve((vector<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_> *
          )CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),in_stack_fffffffffffffe78);
  local_a8 = local_50;
  local_b0._M_cur =
       (__node_type *)
       ::std::
       unordered_map<unsigned_int,_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
       ::begin((unordered_map<unsigned_int,_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                *)CONCAT26(in_stack_fffffffffffffe4e,
                           CONCAT15(in_stack_fffffffffffffe4d,
                                    CONCAT14(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48))))
  ;
  local_b8._M_cur =
       (__node_type *)
       ::std::
       unordered_map<unsigned_int,_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
       ::end((unordered_map<unsigned_int,_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
              *)CONCAT26(in_stack_fffffffffffffe4e,
                         CONCAT15(in_stack_fffffffffffffe4d,
                                  CONCAT14(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48))));
  while (bVar1 = ::std::__detail::operator!=(&local_b0,&local_b8), bVar1) {
    local_c0 = ::std::__detail::_Node_iterator<std::pair<const_unsigned_int,_int>,_false,_false>::
               operator*((_Node_iterator<std::pair<const_unsigned_int,_int>,_false,_false> *)
                         0xaac310);
    ::std::vector<duckdb::alp::AlpRDLeftPartInfo,std::allocator<duckdb::alp::AlpRDLeftPartInfo>>::
    emplace_back<int&,unsigned_int_const&>
              ((vector<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>
                *)in_stack_fffffffffffffe60._M_cur,
               (int *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),
               (uint *)in_stack_fffffffffffffe50);
    ::std::__detail::_Node_iterator<std::pair<const_unsigned_int,_int>,_false,_false>::operator++
              ((_Node_iterator<std::pair<const_unsigned_int,_int>,_false,_false> *)
               in_stack_fffffffffffffe50);
  }
  local_c8 = (AlpRDLeftPartInfo *)
             ::std::
             vector<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>
             ::begin((vector<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>
                      *)CONCAT26(in_stack_fffffffffffffe4e,
                                 CONCAT15(in_stack_fffffffffffffe4d,
                                          CONCAT14(in_stack_fffffffffffffe4c,
                                                   in_stack_fffffffffffffe48))));
  local_d0 = (AlpRDLeftPartInfo *)
             ::std::
             vector<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>
             ::end((vector<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>
                    *)CONCAT26(in_stack_fffffffffffffe4e,
                               CONCAT15(in_stack_fffffffffffffe4d,
                                        CONCAT14(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48
                                                ))));
  ::std::
  sort<__gnu_cxx::__normal_iterator<duckdb::alp::AlpRDLeftPartInfo*,std::vector<duckdb::alp::AlpRDLeftPartInfo,std::allocator<duckdb::alp::AlpRDLeftPartInfo>>>,duckdb::alp::AlpRDCompression<float,true>::BuildLeftPartsDictionary<true>(duckdb::vector<unsigned_int,true>const&,unsigned_char,duckdb::alp::AlpRDCompressionState<float,true>&)::_lambda(duckdb::alp::AlpRDLeftPartInfo_const&,duckdb::alp::AlpRDLeftPartInfo_const&)_1_>
            (local_c8,local_d0);
  local_d8 = 0;
  for (local_e0 = 8; uVar9 = local_e0,
      sVar5 = ::std::
              vector<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>
              ::size(&local_68), uVar9 < sVar5; local_e0 = local_e0 + 1) {
    pvVar6 = vector<duckdb::alp::AlpRDLeftPartInfo,_true>::operator[]
                       ((vector<duckdb::alp::AlpRDLeftPartInfo,_true> *)in_stack_fffffffffffffe50,
                        CONCAT26(in_stack_fffffffffffffe4e,
                                 CONCAT15(in_stack_fffffffffffffe4d,
                                          CONCAT14(in_stack_fffffffffffffe4c,
                                                   in_stack_fffffffffffffe48))));
    local_d8 = pvVar6->count + local_d8;
  }
  sVar5 = ::std::
          vector<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>::
          size(&local_68);
  local_e8 = MinValue<unsigned_long>(8,sVar5);
  __x = ::std::log2<unsigned_long>(0xaac43e);
  ceil(__x);
  b = ExactNumericCast<unsigned_char>((double)in_stack_fffffffffffffe50);
  local_e9 = MaxValue<unsigned_char>('\x01',b);
  for (local_f8 = 0; local_118 = local_e8, local_f8 < local_e8; local_f8 = local_f8 + 1) {
    pvVar6 = vector<duckdb::alp::AlpRDLeftPartInfo,_true>::operator[]
                       ((vector<duckdb::alp::AlpRDLeftPartInfo,_true> *)in_stack_fffffffffffffe50,
                        CONCAT26(in_stack_fffffffffffffe4e,
                                 CONCAT15(in_stack_fffffffffffffe4d,
                                          CONCAT14(in_stack_fffffffffffffe4c,
                                                   in_stack_fffffffffffffe48))));
    uVar3 = UnsafeNumericCast<unsigned_short,unsigned_long,void>(pvVar6->hash);
    *(unsigned_short *)(local_18 + local_f8 * 2 + 0x4004) = uVar3;
    ::std::pair<const_unsigned_short,_unsigned_short>::pair<unsigned_short_&,_unsigned_long_&,_true>
              (&local_fc,(unsigned_short *)(local_18 + local_f8 * 2 + 0x4004),&local_f8);
    pVar8 = ::std::
            unordered_map<unsigned_short,_unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_short>_>_>
            ::insert((unordered_map<unsigned_short,_unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_short>_>_>
                      *)in_stack_fffffffffffffe60._M_cur,
                     (value_type *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
    local_110._M_cur =
         (__node_type *)
         pVar8.first.
         super__Node_iterator_base<std::pair<const_unsigned_short,_unsigned_short>,_false>._M_cur;
    local_108 = pVar8.second;
  }
  while( true ) {
    local_118 = local_118 + 1;
    uVar9 = local_118;
    sVar5 = ::std::
            vector<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>
            ::size(&local_68);
    if (sVar5 <= uVar9) break;
    pvVar6 = vector<duckdb::alp::AlpRDLeftPartInfo,_true>::operator[]
                       ((vector<duckdb::alp::AlpRDLeftPartInfo,_true> *)in_stack_fffffffffffffe50,
                        CONCAT26(in_stack_fffffffffffffe4e,
                                 CONCAT15(in_stack_fffffffffffffe4d,
                                          CONCAT14(in_stack_fffffffffffffe4c,
                                                   in_stack_fffffffffffffe48))));
    ::std::pair<const_unsigned_short,_unsigned_short>::pair<unsigned_long_&,_unsigned_long_&,_true>
              (&local_11c,&pvVar6->hash,&local_118);
    pVar8 = ::std::
            unordered_map<unsigned_short,_unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_short>_>_>
            ::insert((unordered_map<unsigned_short,_unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_short>_>_>
                      *)in_stack_fffffffffffffe60._M_cur,
                     (value_type *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
    in_stack_fffffffffffffe60._M_cur =
         (__node_type *)
         pVar8.first.
         super__Node_iterator_base<std::pair<const_unsigned_short,_unsigned_short>,_false>._M_cur;
    in_stack_fffffffffffffe5f = pVar8.second;
  }
  local_18[1] = local_e9;
  *local_18 = local_9;
  bVar2 = UnsafeNumericCast<unsigned_char,unsigned_long,void>(local_e8);
  local_18[0x5060] = bVar2;
  bVar2 = local_e9;
  uVar3 = UnsafeNumericCast<unsigned_short,unsigned_int,void>(local_d8);
  sVar5 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_8);
  dVar7 = EstimateCompressionSize(local_9,bVar2,uVar3,sVar5);
  vector<duckdb::alp::AlpRDLeftPartInfo,_true>::~vector
            ((vector<duckdb::alp::AlpRDLeftPartInfo,_true> *)0xaac6ee);
  ::std::
  unordered_map<unsigned_int,_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
  ::~unordered_map((unordered_map<unsigned_int,_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                    *)0xaac6fb);
  return dVar7;
}

Assistant:

static double BuildLeftPartsDictionary(const vector<EXACT_TYPE> &values, uint8_t right_bit_width, State &state) {
		unordered_map<EXACT_TYPE, int32_t> left_parts_hash;
		vector<AlpRDLeftPartInfo> left_parts_sorted_repetitions;

		// Building a hash for all the left parts and how many times they appear
		for (auto &value : values) {
			auto left_tmp = value >> right_bit_width;
			left_parts_hash[left_tmp]++;
		}

		// We build a vector from the hash to be able to sort it by repetition count
		left_parts_sorted_repetitions.reserve(left_parts_hash.size());
		for (auto &hash_pair : left_parts_hash) {
			left_parts_sorted_repetitions.emplace_back(hash_pair.second, hash_pair.first);
		}
		sort(left_parts_sorted_repetitions.begin(), left_parts_sorted_repetitions.end(),
		     [](const AlpRDLeftPartInfo &a, const AlpRDLeftPartInfo &b) { return a.count > b.count; });

		// Exceptions are left parts which do not fit in the fixed dictionary size
		uint32_t exceptions_count = 0;
		for (idx_t i = AlpRDConstants::MAX_DICTIONARY_SIZE; i < left_parts_sorted_repetitions.size(); i++) {
			exceptions_count += left_parts_sorted_repetitions[i].count;
		}

		// The left parts bit width after compression is determined by how many elements are in the dictionary
		uint64_t actual_dictionary_size =
		    MinValue<uint64_t>(AlpRDConstants::MAX_DICTIONARY_SIZE, left_parts_sorted_repetitions.size());
		uint8_t left_bit_width =
		    MaxValue<uint8_t>(1, ExactNumericCast<uint8_t>(std::ceil(std::log2(actual_dictionary_size))));

		if (PERSIST_DICT) {
			for (idx_t dict_idx = 0; dict_idx < actual_dictionary_size; dict_idx++) {
				//! The dict keys are mapped to the left part themselves
				state.left_parts_dict[dict_idx] =
				    UnsafeNumericCast<uint16_t>(left_parts_sorted_repetitions[dict_idx].hash);
				state.left_parts_dict_map.insert({state.left_parts_dict[dict_idx], dict_idx});
			}
			//! Pararelly we store a map of the dictionary to quickly resolve exceptions during encoding
			for (idx_t i = actual_dictionary_size + 1; i < left_parts_sorted_repetitions.size(); i++) {
				state.left_parts_dict_map.insert({left_parts_sorted_repetitions[i].hash, i});
			}
			state.left_bit_width = left_bit_width;
			state.right_bit_width = right_bit_width;
			state.actual_dictionary_size = UnsafeNumericCast<uint8_t>(actual_dictionary_size);

			D_ASSERT(state.left_bit_width > 0 && state.right_bit_width > 0 &&
			         state.left_bit_width <= AlpRDConstants::MAX_DICTIONARY_BIT_WIDTH &&
			         state.actual_dictionary_size <= AlpRDConstants::MAX_DICTIONARY_SIZE);
		}

		double estimated_size = EstimateCompressionSize(right_bit_width, left_bit_width,
		                                                UnsafeNumericCast<uint16_t>(exceptions_count), values.size());
		return estimated_size;
	}